

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O2

TypeRenderer *
google::protobuf::util::converter::ProtoStreamObjectSource::FindTypeRenderer(string *type_url)

{
  second_type *pp_Var1;
  
  std::call_once<void(&)()>((once_flag *)&source_renderers_init_,InitRendererMap);
  pp_Var1 = FindOrNull<std::unordered_map<std::__cxx11::string,google::protobuf::util::Status(*)(google::protobuf::util::converter::ProtoStreamObjectSource_const*,google::protobuf::Type_const&,google::protobuf::StringPiece,google::protobuf::util::converter::ObjectWriter*),std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::util::Status(*)(google::protobuf::util::converter::ProtoStreamObjectSource_const*,google::protobuf::Type_const&,google::protobuf::StringPiece,google::protobuf::util::converter::ObjectWriter*)>>>>
                      (renderers__abi_cxx11_,type_url);
  return pp_Var1;
}

Assistant:

ProtoStreamObjectSource::TypeRenderer*
ProtoStreamObjectSource::FindTypeRenderer(const std::string& type_url) {
  PROTOBUF_NAMESPACE_ID::internal::call_once(source_renderers_init_,
                                             InitRendererMap);
  return FindOrNull(*renderers_, type_url);
}